

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

Imputer * __thiscall CoreML::Specification::Imputer::New(Imputer *this,Arena *arena)

{
  Imputer *this_00;
  
  this_00 = (Imputer *)operator_new(0x30);
  Imputer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Imputer>(arena,this_00);
  }
  return this_00;
}

Assistant:

Imputer* Imputer::New(::google::protobuf::Arena* arena) const {
  Imputer* n = new Imputer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}